

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioButton.cpp
# Opt level: O2

void __thiscall
gui::RadioButton::RadioButton
          (RadioButton *this,shared_ptr<gui::RadioButtonStyle> *style,String *name)

{
  shared_ptr<gui::ButtonStyle> local_28;
  
  local_28.super___shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.super___shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Button::Button(&this->super_Button,&local_28,name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  (this->super_Button).super_Widget.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__RadioButton_001dcde8;
  std::__shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->style_).super___shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2>,
             &style->super___shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2>);
  this->styleCopied_ = false;
  this->isChecked_ = false;
  return;
}

Assistant:

RadioButton::RadioButton(std::shared_ptr<RadioButtonStyle> style, const sf::String& name) :
    baseClass(nullptr, name),
    style_(style),
    styleCopied_(false),
    isChecked_(false) {
}